

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O0

MPP_RET hal_jpege_vepu2_gen_regs(void *hal,HalEncTask *task)

{
  MppFrameFormat fmt_00;
  MppBuffer buffer;
  MppBuffer buffer_00;
  JpegeBits *bits_00;
  MppFrameFormat MVar1;
  RK_U32 RVar2;
  int iVar3;
  RK_S32 RVar4;
  uint bytepos_00;
  MPP_RET MVar5;
  JpegeSyntax *syntax_00;
  void *__s;
  size_t sVar6;
  RK_U8 *buf_00;
  size_t sVar7;
  int local_d8;
  undefined4 local_d4;
  RK_S32 i;
  RK_U32 coeffF;
  RK_U32 coeffE;
  RK_U32 coeffC;
  RK_U32 coeffB;
  RK_U32 coeffA;
  RK_U32 SWAP_tmp_1;
  RK_U32 SWAP_tmp;
  RK_U32 rotation;
  VepuFormatCfg fmt_cfg;
  RK_U32 y_fill;
  RK_U32 x_fill;
  RK_S32 bytepos;
  RK_S32 bitpos;
  RK_U8 *qtable [2];
  size_t size;
  RK_U8 *buf;
  size_t length;
  RK_U32 *regs;
  RK_S32 reg_idx;
  JpegeBits bits;
  RK_U32 ver_stride;
  RK_U32 hor_stride;
  MppFrameFormat fmt;
  RK_U32 height;
  RK_U32 width_align;
  RK_U32 width;
  JpegeSyntax *syntax;
  MppBuffer output;
  MppBuffer input;
  HalJpegeCtx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  buffer = task->input;
  buffer_00 = task->output;
  syntax_00 = (JpegeSyntax *)((long)hal + 0x40);
  height = syntax_00->width;
  fmt = height + MPP_FMT_YUV444SP & ~MPP_FMT_YUV444SP;
  RVar2 = *(RK_U32 *)((long)hal + 0x44);
  fmt_00 = *(MppFrameFormat *)((long)hal + 100);
  MVar1 = RVar2 + MPP_FMT_YUV444SP & ~MPP_FMT_YUV444SP;
  bits_00 = *(JpegeBits **)((long)hal + 0x10);
  __s = (void *)(*(long *)((long)hal + 0x18) +
                (ulong)(uint)(*(int *)((long)hal + 0x28) * (task->flags).reg_idx));
  sVar6 = mpp_packet_get_length(task->packet);
  buf_00 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(buffer_00,"hal_jpege_vepu2_gen_regs");
  sVar7 = mpp_buffer_get_size_with_caller(buffer_00,"hal_jpege_vepu2_gen_regs");
  memset(&bytepos,0,0x10);
  fmt_cfg.swap_16_in = '\0';
  fmt_cfg.swap_32_in = '\0';
  fmt_cfg._10_2_ = 0;
  fmt_cfg.r_mask = '\0';
  fmt_cfg.g_mask = '\0';
  fmt_cfg.b_mask = '\0';
  fmt_cfg.swap_8_in = '\0';
  SWAP_tmp_1 = 0;
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","enter hal %p\n","hal_jpege_vepu2_gen_regs",hal);
  }
  if (*(int *)((long)hal + 0x74) != 0) {
    _mpp_log_l(2,"hal_jpege_vepu2","Warning: do not support mirroring\n","hal_jpege_vepu2_gen_regs")
    ;
  }
  if (*(int *)((long)hal + 0x70) == 1) {
    SWAP_tmp_1 = 1;
  }
  else if (*(int *)((long)hal + 0x70) == 3) {
    SWAP_tmp_1 = 2;
  }
  else if (*(int *)((long)hal + 0x70) != 0) {
    _mpp_log_l(2,"hal_jpege_vepu2",
               "Warning: only support 90 or 270 degree rotate, request rotate %d",
               "hal_jpege_vepu2_gen_regs",(ulong)*(uint *)((long)hal + 0x70));
  }
  bits._0_4_ = MVar1;
  hor_stride = RVar2;
  if (SWAP_tmp_1 != 0) {
    bits._0_4_ = fmt;
    hor_stride = height;
    fmt = MVar1;
    height = RVar2;
  }
  RVar2 = get_vepu_pixel_stride
                    ((VepuStrideCfg *)((long)hal + 0x154),height,*(RK_U32 *)((long)hal + 0x48),
                     fmt_00);
  if (((RVar2 & 7) != 0) || (0x7fff < RVar2)) {
    _mpp_log_l(2,"hal_jpege_vepu2",
               "illegal resolution, hor_stride %d, ver_stride %d, width %d, height %d\n",
               "hal_jpege_vepu2_gen_regs",(ulong)*(uint *)((long)hal + 0x48),
               (ulong)*(uint *)((long)hal + 0x4c),syntax_00->width,*(undefined4 *)((long)hal + 0x44)
              );
  }
  fmt_cfg._8_4_ = fmt - height >> 2;
  fmt_cfg._4_4_ = (MppFrameFormat)bits - hor_stride;
  if ((3 < (uint)fmt_cfg._8_4_) &&
     (_mpp_log_l(2,"hal_jpege_vepu2","Assertion %s failed at %s:%d\n",(char *)0x0,"x_fill <= 3",
                 "hal_jpege_vepu2_gen_regs",0x1ac), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((0xf < (uint)fmt_cfg._4_4_) &&
     (_mpp_log_l(2,"hal_jpege_vepu2","Assertion %s failed at %s:%d\n",(char *)0x0,"y_fill <= 15",
                 "hal_jpege_vepu2_gen_regs",0x1ad), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  *(undefined4 *)((long)hal + 0x120) = fmt_cfg._8_4_;
  *(undefined4 *)((long)hal + 0x124) = fmt_cfg._4_4_;
  mpp_buffer_sync_begin_f(buffer_00,0,"hal_jpege_vepu2_gen_regs");
  jpege_bits_setup(bits_00,buf_00,(RK_S32)sVar7);
  jpege_seek_bits(bits_00,(RK_S32)(sVar6 << 3));
  if (*(int *)(*(long *)((long)hal + 0x38) + 0x94) == 2) {
    _bytepos = (RK_U8 *)0x0;
    qtable[0] = (RK_U8 *)0x0;
  }
  else {
    hal_jpege_vepu_rc((HalJpegeCtx *)hal,task);
    _bytepos = *(RK_U8 **)((long)hal + 0x138);
    qtable[0] = *(RK_U8 **)((long)hal + 0x140);
  }
  write_jpeg_header(bits_00,syntax_00,(RK_U8 **)&bytepos);
  memset(__s,0,0x2e0);
  iVar3 = mpp_buffer_get_fd_with_caller(buffer,"hal_jpege_vepu2_gen_regs");
  *(int *)((long)__s + 0xc0) = iVar3;
  *(undefined4 *)((long)__s + 0xc4) = *(undefined4 *)((long)__s + 0xc0);
  *(undefined4 *)((long)__s + 200) = *(undefined4 *)((long)__s + 0xc0);
  RVar4 = jpege_bits_get_bitpos(bits_00);
  bytepos_00 = RVar4 + 7 >> 3;
  *(RK_U8 **)((long)hal + 0x108) = buf_00;
  *(size_t *)((long)hal + 0x110) = sVar7;
  *(RK_S32 *)((long)hal + 0x118) = RVar4;
  *(uint *)((long)hal + 0x11c) = bytepos_00;
  get_msb_lsb_at_pos((RK_U32 *)((long)__s + 0xcc),(RK_U32 *)((long)__s + 0xd0),buf_00,bytepos_00);
  mpp_buffer_sync_end_f(buffer_00,0,"hal_jpege_vepu2_gen_regs");
  *(uint *)((long)__s + 0xd4) = (RK_S32)sVar7 - bytepos_00;
  *(undefined4 *)((long)__s + 0xd8) = 0x1000;
  *(uint *)((long)__s + 0xf0) = (bytepos_00 & 7) << 0x13 | fmt_cfg._8_4_ << 4 | fmt_cfg._4_4_;
  *(RK_U32 *)((long)__s + 0xf4) = RVar2;
  iVar3 = mpp_buffer_get_fd_with_caller(buffer_00,"hal_jpege_vepu2_gen_regs");
  *(int *)((long)__s + 0x134) = iVar3;
  if (bytepos_00 != 0) {
    mpp_dev_set_reg_offset(*hal,0x4d,bytepos_00);
  }
  iVar3 = *(int *)((long)hal + 0xa0);
  if (iVar3 == 0) {
    coeffC = 0x4c85;
    coeffE = 0x962b;
    coeffF = 0x1d50;
    i = 0x9090;
    local_d4 = 0xb694;
  }
  else if (iVar3 == 1) {
    coeffC = 0x366d;
    coeffE = 0xb717;
    coeffF = 0x127c;
    i = 0x89f5;
    local_d4 = 0xa28f;
  }
  else if (iVar3 == 2) {
    coeffC = *(RK_U32 *)((long)hal + 0xa4);
    coeffE = *(RK_U32 *)((long)hal + 0xa8);
    coeffF = *(RK_U32 *)((long)hal + 0xac);
    i = *(RK_S32 *)((long)hal + 0xb0);
    local_d4 = *(undefined4 *)((long)hal + 0xb4);
  }
  else {
    _mpp_log_l(2,"hal_jpege_vepu2","invalid color conversion type %d\n",(char *)0x0,
               (ulong)*(uint *)((long)hal + 0xa0));
    coeffC = 0x4c85;
    coeffE = 0x962b;
    coeffF = 0x1d50;
    i = 0x9090;
    local_d4 = 0xb694;
  }
  *(RK_U32 *)((long)__s + 0x17c) = coeffC | coeffE << 0x10;
  *(RK_U32 *)((long)__s + 0x180) = coeffF | i << 0x10;
  *(undefined4 *)((long)__s + 0x184) = local_d4;
  *(MppFrameFormat *)((long)__s + 0x19c) =
       (fmt >> 4) << 8 | ((MppFrameFormat)bits >> 4) << 0x14 | 0x61;
  MVar5 = get_vepu_fmt((VepuFormatCfg *)&SWAP_tmp,fmt_00);
  if (MVar5 == MPP_OK) {
    *(RK_U32 *)((long)__s + 0x128) = SWAP_tmp << 4 | SWAP_tmp_1 << 2;
    *(uint *)((long)__s + 0x188) =
         (rotation._2_1_ & 0x1f) << 0x10 | (rotation._1_1_ & 0x1f) << 8 | (byte)rotation & 0x1f;
    *(uint *)((long)__s + 0x1a4) =
         ((byte)fmt_cfg.format._1_1_ & 1) << 0x1d | 0x1c000000 |
         ((byte)(undefined1)fmt_cfg.format & 1) << 0x1e | (uint)rotation._3_1_ << 0x1f;
  }
  *(uint *)((long)__s + 0x1ac) =
       (*(uint *)((long)hal + 0xdc) & 0xff) << 0x10 |
       (uint)jpege_restart_marker[*(uint *)((long)hal + 0x128) & 7];
  *(undefined4 *)((long)__s + 0x1b4) = 0x1400;
  if (*(int *)((long)hal + 0xd8) != 0) {
    *(uint *)((long)__s + 0x1ac) = *(uint *)((long)__s + 0x1ac) | 0x1000000;
    *(uint *)((long)__s + 0x1b4) = *(uint *)((long)__s + 0x1b4) | 0x10000;
  }
  for (local_d8 = 0; local_d8 < 0x10; local_d8 = local_d8 + 1) {
    *(uint *)((long)__s + (long)local_d8 * 4) =
         (uint)_bytepos[qp_reorder_table[local_d8 << 2]] << 0x18 |
         (uint)_bytepos[qp_reorder_table[local_d8 * 4 + 1]] << 0x10 |
         (uint)_bytepos[qp_reorder_table[local_d8 * 4 + 2]] << 8 |
         (uint)_bytepos[qp_reorder_table[local_d8 * 4 + 3]];
  }
  for (local_d8 = 0; local_d8 < 0x10; local_d8 = local_d8 + 1) {
    *(uint *)((long)__s + (long)(local_d8 + 0x10) * 4) =
         (uint)qtable[0][qp_reorder_table[local_d8 << 2]] << 0x18 |
         (uint)qtable[0][qp_reorder_table[local_d8 * 4 + 1]] << 0x10 |
         (uint)qtable[0][qp_reorder_table[local_d8 * 4 + 2]] << 8 |
         (uint)qtable[0][qp_reorder_table[local_d8 * 4 + 3]];
  }
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","leave hal %p\n","hal_jpege_vepu2_gen_regs",hal);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_vepu2_gen_regs(void *hal, HalEncTask *task)
{
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    MppBuffer input  = task->input;
    MppBuffer output = task->output;
    JpegeSyntax *syntax = &ctx->syntax;
    RK_U32 width        = syntax->width;
    RK_U32 width_align  = MPP_ALIGN(width, 16);
    RK_U32 height       = syntax->height;
    MppFrameFormat fmt  = syntax->format;
    RK_U32 hor_stride   = 0;
    RK_U32 ver_stride   = MPP_ALIGN(height, 16);
    JpegeBits bits      = ctx->bits;
    RK_S32 reg_idx      = task->flags.reg_idx;
    RK_U32 *regs = (RK_U32 *)((RK_U8 *)ctx->regs + ctx->reg_size * reg_idx);
    size_t length = mpp_packet_get_length(task->packet);
    RK_U8  *buf = mpp_buffer_get_ptr(output);
    size_t size = mpp_buffer_get_size(output);
    const RK_U8 *qtable[2] = {NULL};
    RK_S32 bitpos;
    RK_S32 bytepos;
    RK_U32 x_fill = 0;
    RK_U32 y_fill = 0;
    VepuFormatCfg fmt_cfg;
    RK_U32 rotation = 0;

    hal_jpege_dbg_func("enter hal %p\n", hal);

    // do not support mirroring
    if (syntax->mirroring)
        mpp_err_f("Warning: do not support mirroring\n");

    if (syntax->rotation == MPP_ENC_ROT_90)
        rotation = 1;
    else if (syntax->rotation == MPP_ENC_ROT_270)
        rotation = 2;
    else if (syntax->rotation != MPP_ENC_ROT_0)
        mpp_err_f("Warning: only support 90 or 270 degree rotate, request rotate %d", syntax->rotation);
    if (rotation) {
        MPP_SWAP(RK_U32, width, height);
        MPP_SWAP(RK_U32, width_align, ver_stride);
    }
    hor_stride = get_vepu_pixel_stride(&ctx->stride_cfg, width,
                                       syntax->hor_stride, fmt);

    //hor_stride must be align with 8, and ver_stride mus align with 2
    if ((hor_stride & 0x7) || (ver_stride & 0x1) || (hor_stride >= (1 << 15))) {
        mpp_err_f("illegal resolution, hor_stride %d, ver_stride %d, width %d, height %d\n",
                  syntax->hor_stride, syntax->ver_stride,
                  syntax->width, syntax->height);
    }

    x_fill = (width_align - width) / 4;
    y_fill = (ver_stride - height);
    mpp_assert(x_fill <= 3);
    mpp_assert(y_fill <= 15);
    ctx->part_x_fill = x_fill;
    ctx->part_y_fill = y_fill;

    mpp_buffer_sync_begin(output);

    /* write header to output buffer */
    jpege_bits_setup(bits, buf, (RK_U32)size);
    /* seek length bytes data */
    jpege_seek_bits(bits, length << 3);
    /* NOTE: write header will update qtable */
    if (ctx->cfg->rc.rc_mode != MPP_ENC_RC_MODE_FIXQP) {
        hal_jpege_vepu_rc(ctx, task);
        qtable[0] = ctx->hal_rc.qtable_y;
        qtable[1] = ctx->hal_rc.qtable_c;
    } else {
        qtable[0] = NULL;
        qtable[1] = NULL;
    }
    write_jpeg_header(bits, syntax, qtable);

    memset(regs, 0, sizeof(RK_U32) * VEPU_JPEGE_VEPU2_NUM_REGS);
    // input address setup
    regs[VEPU2_REG_INPUT_Y] = mpp_buffer_get_fd(input);
    regs[VEPU2_REG_INPUT_U] = regs[VEPU2_REG_INPUT_Y];
    regs[VEPU2_REG_INPUT_V] = regs[VEPU2_REG_INPUT_Y];

    // output address setup
    bitpos = jpege_bits_get_bitpos(bits);
    bytepos = (bitpos + 7) >> 3;
    ctx->base = buf;
    ctx->size = size;
    ctx->sw_bit = bitpos;
    ctx->part_bytepos = bytepos;

    get_msb_lsb_at_pos(&regs[51], &regs[52], buf, bytepos);

    mpp_buffer_sync_end(output);

    regs[53] = size - bytepos;

    // bus config
    regs[54] = 16 << 8;

    regs[60] = (((bytepos & 7) * 8) << 16) |
               (x_fill << 4) |
               (y_fill);
    regs[61] = hor_stride;

    regs[77] = mpp_buffer_get_fd(output);
    if (bytepos)
        mpp_dev_set_reg_offset(ctx->dev, 77, bytepos);
    /* 95 - 97 color conversion parameter */
    {
        RK_U32 coeffA;
        RK_U32 coeffB;
        RK_U32 coeffC;
        RK_U32 coeffE;
        RK_U32 coeffF;

        switch (syntax->color_conversion_type) {
        case 0 : {  /* BT.601 */
            /*
             * Y  = 0.2989 R + 0.5866 G + 0.1145 B
             * Cb = 0.5647 (B - Y) + 128
             * Cr = 0.7132 (R - Y) + 128
             */
            coeffA = 19589;
            coeffB = 38443;
            coeffC = 7504;
            coeffE = 37008;
            coeffF = 46740;
        } break;
        case 1 : {  /* BT.709 */
            /*
             * Y  = 0.2126 R + 0.7152 G + 0.0722 B
             * Cb = 0.5389 (B - Y) + 128
             * Cr = 0.6350 (R - Y) + 128
             */
            coeffA = 13933;
            coeffB = 46871;
            coeffC = 4732;
            coeffE = 35317;
            coeffF = 41615;
        } break;
        case 2 : {
            coeffA = syntax->coeffA;
            coeffB = syntax->coeffB;
            coeffC = syntax->coeffC;
            coeffE = syntax->coeffE;
            coeffF = syntax->coeffF;
        } break;
        default : {
            mpp_err("invalid color conversion type %d\n",
                    syntax->color_conversion_type);
            coeffA = 19589;
            coeffB = 38443;
            coeffC = 7504;
            coeffE = 37008;
            coeffF = 46740;
        } break;
        }

        regs[95] = coeffA | (coeffB << 16);
        regs[96] = coeffC | (coeffE << 16);
        regs[97] = coeffF;
    }

    regs[103] = (width_align >> 4) << 8  |
                (ver_stride >> 4) << 20 |
                (1 << 6) |  /* intra coding  */
                (2 << 4) |  /* format jpeg   */
                1;          /* encoder start */

    if (!get_vepu_fmt(&fmt_cfg, fmt)) {
        regs[74] = (fmt_cfg.format << 4) |
                   (rotation << 2);
        regs[98] = (fmt_cfg.b_mask & 0x1f) << 16 |
                   (fmt_cfg.g_mask & 0x1f) << 8  |
                   (fmt_cfg.r_mask & 0x1f);
        regs[105] = 7 << 26 | (fmt_cfg.swap_32_in & 1) << 29 |
                    (fmt_cfg.swap_16_in & 1) << 30 |
                    (fmt_cfg.swap_8_in & 1) << 31;
    }

    regs[107] = ((syntax->part_rows & 0xff) << 16) |
                jpege_restart_marker[ctx->rst_marker_idx & 7];

    /* encoder interrupt */
    regs[109] = 1 << 12 |   /* clock gating */
                1 << 10;    /* enable timeout interrupt */

    if (syntax->low_delay) {
        /* slice encode end by RST */
        regs[107] |= (1 << 24);
        /* slice interrupt enable */
        regs[109] |= (1 << 16);
    }

    /* 0 ~ 31 quantization tables */
    {
        RK_S32 i;

        for (i = 0; i < 16; i++) {
            /* qtable need to reorder in particular order */
            regs[i] = qtable[0][qp_reorder_table[i * 4 + 0]] << 24 |
                      qtable[0][qp_reorder_table[i * 4 + 1]] << 16 |
                      qtable[0][qp_reorder_table[i * 4 + 2]] << 8 |
                      qtable[0][qp_reorder_table[i * 4 + 3]];
        }
        for (i = 0; i < 16; i++) {
            /* qtable need to reorder in particular order */
            regs[i + 16] = qtable[1][qp_reorder_table[i * 4 + 0]] << 24 |
                           qtable[1][qp_reorder_table[i * 4 + 1]] << 16 |
                           qtable[1][qp_reorder_table[i * 4 + 2]] << 8 |
                           qtable[1][qp_reorder_table[i * 4 + 3]];
        }
    }

    hal_jpege_dbg_func("leave hal %p\n", hal);
    return MPP_OK;
}